

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcompress.c
# Opt level: O0

int uncompress2mem_from_mem
              (char *inmemptr,size_t inmemsize,char **buffptr,size_t *buffsize,
              _func_void_ptr_void_ptr_size_t *mem_realloc,size_t *filesize,int *status)

{
  int iVar1;
  long lVar2;
  long *in_RCX;
  long *in_RDX;
  undefined8 in_RDI;
  code *in_R8;
  undefined8 *in_R9;
  z_stream d_stream;
  int err;
  undefined8 local_b0 [3];
  long local_98;
  undefined4 local_90;
  undefined8 local_88;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  int local_3c;
  undefined8 *local_38;
  code *local_30;
  long *local_28;
  long *local_20;
  undefined8 local_10;
  int local_4;
  
  if (*(int *)d_stream.next_in < 1) {
    local_70 = 0;
    local_68 = 0;
    local_60 = 0;
    local_38 = in_R9;
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    iVar1 = inflateInit2_(local_b0,0x1f,"1.2.11",0x70);
    if (iVar1 == 0) {
      local_b0[0] = local_10;
      local_98 = *local_20;
      local_90 = (undefined4)*local_28;
      local_3c = 0;
      while (local_3c = inflate(local_b0,0), local_3c != 1) {
        if ((local_3c != 0) && (local_3c != -5)) {
          inflateEnd(local_b0);
          d_stream.next_in[0] = 0x9e;
          d_stream.next_in[1] = '\x01';
          d_stream.next_in[2] = '\0';
          d_stream.next_in[3] = '\0';
          return 0x19e;
        }
        if (local_30 == (code *)0x0) {
          inflateEnd(local_b0);
          d_stream.next_in[0] = 0x9e;
          d_stream.next_in[1] = '\x01';
          d_stream.next_in[2] = '\0';
          d_stream.next_in[3] = '\0';
          return 0x19e;
        }
        lVar2 = (*local_30)(*local_20);
        *local_20 = lVar2;
        if (*local_20 == 0) {
          inflateEnd(local_b0);
          d_stream.next_in[0] = 0x9e;
          d_stream.next_in[1] = '\x01';
          d_stream.next_in[2] = '\0';
          d_stream.next_in[3] = '\0';
          return 0x19e;
        }
        local_90 = 0x7080;
        local_98 = *local_20 + *local_28;
        *local_28 = *local_28 + 0x7080;
      }
      if (local_38 != (undefined8 *)0x0) {
        *local_38 = local_88;
      }
      iVar1 = inflateEnd(local_b0);
      if (iVar1 == 0) {
        local_4 = *(int *)d_stream.next_in;
      }
      else {
        d_stream.next_in[0] = 0x9e;
        d_stream.next_in[1] = '\x01';
        d_stream.next_in[2] = '\0';
        d_stream.next_in[3] = '\0';
        local_4 = 0x19e;
      }
    }
    else {
      d_stream.next_in[0] = 0x9e;
      d_stream.next_in[1] = '\x01';
      d_stream.next_in[2] = '\0';
      d_stream.next_in[3] = '\0';
      local_4 = 0x19e;
    }
  }
  else {
    local_4 = *(int *)d_stream.next_in;
  }
  return local_4;
}

Assistant:

int uncompress2mem_from_mem(                                                
             char *inmemptr,     /* I - memory pointer to compressed bytes */
             size_t inmemsize,   /* I - size of input compressed file      */
             char **buffptr,   /* IO - memory pointer                      */
             size_t *buffsize,   /* IO - size of buffer, in bytes           */
             void *(*mem_realloc)(void *p, size_t newsize), /* function     */
             size_t *filesize,   /* O - size of file, in bytes              */
             int *status)        /* IO - error status                       */

/*
  Uncompress the file in memory into memory.  Fill whatever amount of memory has
  already been allocated, then realloc more memory, using the supplied
  input function, if necessary.
*/
{
    int err; 
    z_stream d_stream;   /* decompression stream */

    if (*status > 0) 
        return(*status); 

    d_stream.zalloc = (alloc_func)0;
    d_stream.zfree = (free_func)0;
    d_stream.opaque = (voidpf)0;

    /* Initialize the decompression.  The argument (15+16) tells the
       decompressor that we are to use the gzip algorithm */
    err = inflateInit2(&d_stream, (15+16));
    if (err != Z_OK) return(*status = 414);

    d_stream.next_in = (unsigned char*)inmemptr;
    d_stream.avail_in = inmemsize;

    d_stream.next_out = (unsigned char*) *buffptr;
    d_stream.avail_out = *buffsize;

    for (;;) {
        /* uncompress as much of the input as will fit in the output */
        err = inflate(&d_stream, Z_NO_FLUSH);

        if (err == Z_STREAM_END) { /* We reached the end of the input */
	    break; 
        } else if (err == Z_OK || err == Z_BUF_ERROR) { /* need more space in output buffer */
	    /* Z_BUF_ERROR means need more input data to make progress */

            if (mem_realloc) {   
                *buffptr = mem_realloc(*buffptr,*buffsize + BUFFINCR);
                if (*buffptr == NULL){
                    inflateEnd(&d_stream);
                    return(*status = 414);  /* memory allocation failed */
                }

                d_stream.avail_out = BUFFINCR;
                d_stream.next_out = (unsigned char*) (*buffptr + *buffsize);
                *buffsize = *buffsize + BUFFINCR;

            } else  { /* error: no realloc function available */
                inflateEnd(&d_stream);
                return(*status = 414);
            }
        } else {  /* some other error */
            inflateEnd(&d_stream);
            return(*status = 414);
        }
    }

    /* Set the output file size to be the total output data */
    if (filesize) *filesize = d_stream.total_out;

    /* End the decompression */
    err = inflateEnd(&d_stream);

    if (err != Z_OK) return(*status = 414);
    
    return(*status);
}